

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fd-socket.c
# Opt level: O1

void fdsocket_error_callback(void *vs)

{
  FdSocket *fds;
  
  if (*(int *)((long)vs + 0x2074) != 0) {
    plug_closing_errno(*(Plug **)((long)vs + 0x2088),*(int *)((long)vs + 0x2074));
    return;
  }
  return;
}

Assistant:

static void fdsocket_error_callback(void *vs)
{
    FdSocket *fds = (FdSocket *)vs;

    /*
     * Just in case other socket work has caused this socket to vanish
     * or become somehow non-erroneous before this callback arrived...
     */
    if (!fds->pending_error)
        return;

    /*
     * An error has occurred on this socket. Pass it to the plug.
     */
    plug_closing_errno(fds->plug, fds->pending_error);
}